

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseprov.c
# Opt level: O0

int ossl_base_provider_init
              (OSSL_CORE_HANDLE *handle,OSSL_DISPATCH *in,OSSL_DISPATCH **out,void **provctx)

{
  int iVar1;
  PROV_CTX *pPVar2;
  BIO_METHOD *corebiometh_00;
  OSSL_LIB_CTX *libctx;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  OSSL_DISPATCH *in_RSI;
  OSSL_CORE_HANDLE *in_RDI;
  BIO_METHOD *corebiometh;
  OSSL_FUNC_core_get_libctx_fn *c_get_libctx;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  OSSL_FUNC_core_get_libctx_fn *local_30;
  OSSL_DISPATCH *local_18;
  int local_4;
  
  local_30 = (OSSL_FUNC_core_get_libctx_fn *)0x0;
  iVar1 = ossl_prov_bio_from_dispatch
                    ((OSSL_DISPATCH *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))
  ;
  local_18 = in_RSI;
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    for (; local_18->function_id != 0; local_18 = local_18 + 1) {
      iVar1 = local_18->function_id;
      if (iVar1 == 1) {
        c_gettable_params = OSSL_FUNC_core_gettable_params(local_18);
      }
      else if (iVar1 == 2) {
        c_get_params = OSSL_FUNC_core_get_params(local_18);
      }
      else if (iVar1 == 4) {
        local_30 = OSSL_FUNC_core_get_libctx(local_18);
      }
    }
    if (local_30 == (OSSL_FUNC_core_get_libctx_fn *)0x0) {
      local_4 = 0;
    }
    else {
      pPVar2 = ossl_prov_ctx_new();
      *in_RCX = pPVar2;
      if ((pPVar2 == (PROV_CTX *)0x0) ||
         (corebiometh_00 = ossl_bio_prov_init_bio_method(), corebiometh_00 == (BIO_METHOD *)0x0)) {
        ossl_prov_ctx_free((PROV_CTX *)0x2e6cf1);
        *in_RCX = 0;
        local_4 = 0;
      }
      else {
        pPVar2 = (PROV_CTX *)*in_RCX;
        libctx = (OSSL_LIB_CTX *)(*local_30)(in_RDI);
        ossl_prov_ctx_set0_libctx(pPVar2,libctx);
        ossl_prov_ctx_set0_handle((PROV_CTX *)*in_RCX,in_RDI);
        ossl_prov_ctx_set0_core_bio_method((PROV_CTX *)*in_RCX,corebiometh_00);
        *in_RDX = base_dispatch_table;
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int ossl_base_provider_init(const OSSL_CORE_HANDLE *handle,
                            const OSSL_DISPATCH *in, const OSSL_DISPATCH **out,
                            void **provctx)
{
    OSSL_FUNC_core_get_libctx_fn *c_get_libctx = NULL;
    BIO_METHOD *corebiometh;

    if (!ossl_prov_bio_from_dispatch(in))
        return 0;
    for (; in->function_id != 0; in++) {
        switch (in->function_id) {
        case OSSL_FUNC_CORE_GETTABLE_PARAMS:
            c_gettable_params = OSSL_FUNC_core_gettable_params(in);
            break;
        case OSSL_FUNC_CORE_GET_PARAMS:
            c_get_params = OSSL_FUNC_core_get_params(in);
            break;
        case OSSL_FUNC_CORE_GET_LIBCTX:
            c_get_libctx = OSSL_FUNC_core_get_libctx(in);
            break;
        default:
            /* Just ignore anything we don't understand */
            break;
        }
    }

    if (c_get_libctx == NULL)
        return 0;

    /*
     * We want to make sure that all calls from this provider that requires
     * a library context use the same context as the one used to call our
     * functions.  We do that by passing it along in the provider context.
     *
     * This only works for built-in providers.  Most providers should
     * create their own library context.
     */
    if ((*provctx = ossl_prov_ctx_new()) == NULL
            || (corebiometh = ossl_bio_prov_init_bio_method()) == NULL) {
        ossl_prov_ctx_free(*provctx);
        *provctx = NULL;
        return 0;
    }
    ossl_prov_ctx_set0_libctx(*provctx,
                                       (OSSL_LIB_CTX *)c_get_libctx(handle));
    ossl_prov_ctx_set0_handle(*provctx, handle);
    ossl_prov_ctx_set0_core_bio_method(*provctx, corebiometh);

    *out = base_dispatch_table;

    return 1;
}